

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

QPixmapStylePixmap * __thiscall
QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>::value
          (QPixmapStylePixmap *__return_storage_ptr__,
          QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *this,ControlPixmap *key)

{
  Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *pNVar1;
  QPixmap *pQVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  if (this->d != (Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_> *)0x0)
  {
    pNVar1 = QHashPrivate::
             Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_>::
             findNode<QPixmapStyle::ControlPixmap>(this->d,key);
    if (pNVar1 != (Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *)0x0) {
      pQVar2 = &(pNVar1->value).pixmap;
      goto LAB_003470f8;
    }
  }
  pQVar2 = (QPixmap *)0x0;
LAB_003470f8:
  if (pQVar2 == (QPixmap *)0x0) {
    *(undefined8 *)&__return_storage_ptr__->field_0x10 = 0;
    (__return_storage_ptr__->margins).m_left = 0;
    (__return_storage_ptr__->margins).m_top = 0;
    *(undefined8 *)__return_storage_ptr__ = 0;
    *(undefined8 *)&__return_storage_ptr__->field_0x8 = 0;
    (__return_storage_ptr__->margins).m_right = 0;
    (__return_storage_ptr__->margins).m_bottom = 0;
    QPixmap::QPixmap(&__return_storage_ptr__->pixmap);
    iVar3 = 0;
    iVar4 = 0;
    iVar5 = 0;
    iVar6 = 0;
  }
  else {
    QPixmap::QPixmap(&__return_storage_ptr__->pixmap,pQVar2);
    iVar3 = *(int *)(pQVar2 + 0x18);
    iVar4 = *(int *)(pQVar2 + 0x1c);
    iVar5 = *(int *)(pQVar2 + 0x20);
    iVar6 = *(int *)(pQVar2 + 0x24);
  }
  (__return_storage_ptr__->margins).m_left.m_i = iVar3;
  (__return_storage_ptr__->margins).m_top.m_i = iVar4;
  (__return_storage_ptr__->margins).m_right.m_i = iVar5;
  (__return_storage_ptr__->margins).m_bottom.m_i = iVar6;
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }